

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_commands.cpp
# Opt level: O1

Am_Value am_checked_from_command_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Object *in_RSI;
  Am_Value AVar3;
  Am_Object cmd;
  Am_Value v;
  Am_Object AStack_38;
  Am_Object local_30;
  Am_Value local_28;
  
  Am_Value::Am_Value((Am_Value *)self,&Am_No_Value);
  local_28.type = 0;
  local_28.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = Am_Object::Get(in_RSI,0xc5,1);
  Am_Value::operator=(&local_28,pAVar2);
  bVar1 = Am_Value::Valid(&local_28);
  if (bVar1 && local_28.type == 0xa001) {
    Am_Object::Am_Object(&AStack_38,&local_28);
    Am_Object::Am_Object(&local_30,&Am_Command);
    bVar1 = Am_Object::Is_Instance_Of(&AStack_38,&local_30);
    Am_Object::~Am_Object(&local_30);
    if (bVar1) {
      pAVar2 = Am_Object::Get(&AStack_38,0x1ab,1);
      Am_Value::operator=((Am_Value *)self,pAVar2);
    }
    Am_Object::~Am_Object(&AStack_38);
  }
  Am_Value::~Am_Value(&local_28);
  AVar3.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar3._0_8_ = self;
  return AVar3;
}

Assistant:

Am_Define_Formula(Am_Value, am_checked_from_command)
{
  Am_Value ret = Am_No_Value; // not checked if no command object
  Am_Value v;
  v = self.Peek(Am_COMMAND);
  if (v.Valid() && v.type == Am_OBJECT) {
    Am_Object cmd = v;
    if (cmd.Is_Instance_Of(Am_Command))
      ret = cmd.Peek(Am_CHECKED_ITEM);
  }
  return ret;
}